

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_CreateMonitoredItems
               (UA_Server *server,UA_Session *session,UA_CreateMonitoredItemsRequest *request,
               UA_CreateMonitoredItemsResponse *response)

{
  size_t __nmemb;
  UA_MonitoredItemCreateRequest *pUVar1;
  long lVar2;
  long *plVar3;
  UA_MonitoredItem *pUVar4;
  UA_StatusCode UVar5;
  UA_UInt32 UVar6;
  UA_MonitoredItemCreateResult *pUVar7;
  UA_Session *pUVar8;
  UA_Session *session_00;
  size_t i;
  ulong uVar9;
  long lVar10;
  long lVar11;
  UA_Subscription *pUVar12;
  UA_DataValue local_d8;
  UA_ReadValueId *local_78;
  UA_CreateMonitoredItemsResponse *local_70;
  UA_ListOfUAMonitoredItems *local_68;
  UA_UInt32 *local_60;
  UA_TimestampsToReturn local_54;
  UA_Server *local_50;
  UA_Session *local_48;
  UA_MonitoredItemCreateResult *local_40;
  UA_CreateMonitoredItemsRequest *local_38;
  
  UVar5 = 0x802b0000;
  if (request->timestampsToReturn < 4) {
    pUVar12 = (UA_Subscription *)&session->serverSubscriptions;
    do {
      pUVar12 = (pUVar12->listEntry).le_next;
      if (pUVar12 == (UA_Subscription *)0x0) {
        UVar5 = 0x80280000;
        goto LAB_00124f44;
      }
    } while (pUVar12->subscriptionID != request->subscriptionId);
    pUVar12->currentLifetimeCount = 0;
    __nmemb = request->itemsToCreateSize;
    if (__nmemb == 0) {
      UVar5 = 0x800f0000;
    }
    else {
      session_00 = (UA_Session *)0x48;
      local_50 = server;
      local_38 = request;
      pUVar7 = (UA_MonitoredItemCreateResult *)calloc(__nmemb,0x48);
      response->results = pUVar7;
      if (pUVar7 != (UA_MonitoredItemCreateResult *)0x0) {
        response->resultsSize = __nmemb;
        local_68 = &pUVar12->monitoredItems;
        lVar11 = 0x50;
        lVar10 = 0;
        uVar9 = 0;
        local_70 = response;
        do {
          local_54 = local_38->timestampsToReturn;
          pUVar1 = local_38->itemsToCreate;
          local_78 = (UA_ReadValueId *)((long)pUVar1 + lVar11 + -0x50);
          local_40 = local_70->results;
          local_d8.serverTimestamp = 0;
          local_d8.serverPicoseconds = 0;
          local_d8._90_6_ = 0;
          local_d8.sourceTimestamp = 0;
          local_d8.sourcePicoseconds = 0;
          local_d8._74_6_ = 0;
          local_d8.value.arrayDimensions = (UA_UInt32 *)0x0;
          local_d8.status = 0;
          local_d8._60_4_ = 0;
          local_d8.value.data = (void *)0x0;
          local_d8.value.arrayDimensionsSize = 0;
          local_d8.value.storageType = UA_VARIANT_DATA;
          local_d8.value._12_4_ = 0;
          local_d8.value.arrayLength = 0;
          local_d8._0_8_ = 0;
          local_d8.value.type = (UA_DataType *)0x0;
          Service_Read_single(local_50,session_00,local_54,local_78,&local_d8);
          if (((((local_d8._0_8_ & 2) == 0) || (-1 < (int)local_d8.status)) ||
              (local_d8.status == 0x80040000)) ||
             ((local_d8.status == 0x80050000 || (local_d8.status == 0x80320000)))) {
            session_00 = (UA_Session *)(UA_TYPES + 0x16);
            deleteMembers_noInit(&local_d8,UA_TYPES + 0x16);
            local_d8.serverTimestamp = 0;
            local_d8.serverPicoseconds = 0;
            local_d8._90_6_ = 0;
            local_d8.sourceTimestamp = 0;
            local_d8.sourcePicoseconds = 0;
            local_d8._74_6_ = 0;
            local_d8.value.arrayDimensions = (UA_UInt32 *)0x0;
            local_d8.status = 0;
            local_d8._60_4_ = 0;
            local_d8.value.data = (void *)0x0;
            local_d8.value.arrayDimensionsSize = 0;
            local_d8.value.storageType = UA_VARIANT_DATA;
            local_d8.value._12_4_ = 0;
            local_d8.value.arrayLength = 0;
            local_d8._0_8_ = 0;
            local_d8.value.type = (UA_DataType *)0x0;
            lVar2 = *(long *)((long)pUVar1 + lVar11 + -0x18);
            if (lVar2 == 0) {
              local_60 = (UA_UInt32 *)((long)pUVar1 + lVar11 + -0x38);
LAB_00124dc1:
              pUVar8 = (UA_Session *)UA_MonitoredItem_new();
              if (pUVar8 == (UA_Session *)0x0) {
                *(undefined4 *)((long)&local_40->statusCode + lVar10) = 0x80030000;
              }
              else {
                local_48 = pUVar8;
                UVar5 = UA_copy(local_78,(UA_NodeId *)
                                         &(pUVar8->clientDescription).applicationName.locale.data,
                                UA_TYPES + 0x10);
                if (UVar5 == 0) {
                  (local_48->clientDescription).productUri.length = (size_t)pUVar12;
                  (local_48->clientDescription).applicationType = *local_60;
                  UVar6 = pUVar12->lastMonitoredItemId + 1;
                  pUVar12->lastMonitoredItemId = UVar6;
                  *(UA_UInt32 *)&(local_48->clientDescription).productUri.data = UVar6;
                  *(UA_TimestampsToReturn *)
                   &(local_48->clientDescription).applicationName.locale.length = local_54;
                  setMonitoredItemSettings
                            (local_50,(UA_MonitoredItem *)local_48,
                             *(UA_MonitoringMode *)((long)pUVar1 + lVar11 + -8),
                             (UA_MonitoringParameters *)
                             ((long)&(pUVar1->itemToMonitor).nodeId.namespaceIndex + lVar11));
                  pUVar4 = (pUVar12->monitoredItems).lh_first;
                  (local_48->clientDescription).applicationUri.length = (size_t)pUVar4;
                  if (pUVar4 != (UA_MonitoredItem *)0x0) {
                    (pUVar4->listEntry).le_prev = (UA_MonitoredItem **)local_48;
                  }
                  local_68->lh_first = (UA_MonitoredItem *)local_48;
                  (local_48->clientDescription).applicationUri.data = (UA_Byte *)local_68;
                  if (*(int *)((long)pUVar1 + lVar11 + -8) == 2) {
                    UA_MoniteredItem_SampleCallback(local_50,(UA_MonitoredItem *)local_48);
                  }
                  pUVar8 = local_48;
                  session_00 = (UA_Session *)&(local_48->clientDescription).discoveryProfileUri.data
                  ;
                  UA_copy((void *)((long)pUVar1 + lVar11 + -0x30),session_00,UA_TYPES + 0xb);
                  *(size_t *)((long)&local_40->revisedSamplingInterval + lVar10) =
                       (pUVar8->clientDescription).gatewayServerUri.length;
                  *(undefined4 *)((long)&local_40->revisedQueueSize + lVar10) =
                       *(undefined4 *)((long)&(pUVar8->clientDescription).gatewayServerUri.data + 4)
                  ;
                  *(undefined4 *)((long)&local_40->monitoredItemId + lVar10) =
                       *(undefined4 *)&(pUVar8->clientDescription).productUri.data;
                }
                else {
                  *(UA_StatusCode *)((long)&local_40->statusCode + lVar10) = UVar5;
                  session_00 = local_48;
                  MonitoredItem_delete(local_50,(UA_MonitoredItem *)local_48);
                }
              }
            }
            else if (((lVar2 == 0xe) &&
                     (plVar3 = *(long **)((long)pUVar1 + lVar11 + -0x10),
                     *(long *)((long)plVar3 + 6) == 0x7972616e69422074 &&
                     *plVar3 == 0x20746c7561666544)) &&
                    (*(short *)((long)pUVar1 + lVar11 + -0x20) == 0)) {
              if (*(int *)((long)pUVar1 + lVar11 + -0x38) == 0xd) {
                local_60 = &pUVar1[uVar9].itemToMonitor.attributeId;
                goto LAB_00124dc1;
              }
              *(undefined4 *)((long)&local_40->statusCode + lVar10) = 0x80380000;
            }
            else {
              *(undefined4 *)((long)&local_40->statusCode + lVar10) = 0x80390000;
            }
          }
          else {
            *(UA_StatusCode *)((long)&local_40->statusCode + lVar10) = local_d8.status;
            session_00 = (UA_Session *)(UA_TYPES + 0x16);
            deleteMembers_noInit(&local_d8,UA_TYPES + 0x16);
          }
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x48;
          lVar11 = lVar11 + 0x98;
          if (local_38->itemsToCreateSize <= uVar9) {
            return;
          }
        } while( true );
      }
      UVar5 = 0x80030000;
    }
  }
LAB_00124f44:
  (response->responseHeader).serviceResult = UVar5;
  return;
}

Assistant:

void
Service_CreateMonitoredItems(UA_Server *server, UA_Session *session,
                             const UA_CreateMonitoredItemsRequest *request,
                             UA_CreateMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing CreateMonitoredItemsRequest");

    /* Check if the timestampstoreturn is valid */
    if(request->timestampsToReturn > UA_TIMESTAMPSTORETURN_NEITHER) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADTIMESTAMPSTORETURNINVALID;
        return;
    }

    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    if(request->itemsToCreateSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->itemsToCreateSize,
                                     &UA_TYPES[UA_TYPES_MONITOREDITEMCREATERESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->itemsToCreateSize;

    for(size_t i = 0; i < request->itemsToCreateSize; ++i)
        Service_CreateMonitoredItems_single(server, session, sub, request->timestampsToReturn,
                                            &request->itemsToCreate[i], &response->results[i]);
}